

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5SorterNext(Fts5Cursor *pCsr)

{
  int iVar1;
  Fts5Sorter *pFVar2;
  sqlite3_stmt *psVar3;
  int iVar4;
  uint uVar5;
  Mem *pMVar6;
  i64 iVar7;
  u8 *p;
  long lVar8;
  int iVar9;
  int iVal;
  u32 local_44;
  u8 *local_40;
  Fts5Cursor *local_38;
  
  pFVar2 = pCsr->pSorter;
  iVar4 = sqlite3_step(pFVar2->pStmt);
  if (iVar4 == 0x65) {
    uVar5 = 1;
  }
  else {
    if (iVar4 != 100) {
      return iVar4;
    }
    psVar3 = pFVar2->pStmt;
    pMVar6 = columnMem(psVar3,0);
    iVar7 = sqlite3VdbeIntValue(pMVar6);
    columnMallocFailure(psVar3);
    pFVar2->iRowid = iVar7;
    iVar4 = sqlite3_column_bytes(pFVar2->pStmt,1);
    psVar3 = pFVar2->pStmt;
    pMVar6 = columnMem(psVar3,1);
    p = (u8 *)sqlite3_value_blob(pMVar6);
    columnMallocFailure(psVar3);
    uVar5 = 0x4e;
    if (0 < iVar4) {
      iVar1 = pFVar2->nIdx;
      iVar9 = 0;
      local_40 = p;
      local_38 = pCsr;
      if ((long)iVar1 < 2) {
        lVar8 = 0;
      }
      else {
        lVar8 = 0;
        do {
          uVar5 = sqlite3Fts5GetVarint32(p,&local_44);
          iVar9 = iVar9 + local_44;
          p = p + uVar5;
          pFVar2->aIdx[lVar8] = iVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (long)iVar1 + -1);
      }
      pFVar2->aIdx[lVar8] = ((int)local_40 + iVar4) - (int)p;
      pFVar2->aPoslist = p;
      uVar5 = 0x4e;
      pCsr = local_38;
    }
  }
  pCsr->csrflags = pCsr->csrflags | uVar5;
  return 0;
}

Assistant:

static int fts5SorterNext(Fts5Cursor *pCsr){
  Fts5Sorter *pSorter = pCsr->pSorter;
  int rc;

  rc = sqlite3_step(pSorter->pStmt);
  if( rc==SQLITE_DONE ){
    rc = SQLITE_OK;
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }else if( rc==SQLITE_ROW ){
    const u8 *a;
    const u8 *aBlob;
    int nBlob;
    int i;
    int iOff = 0;
    rc = SQLITE_OK;

    pSorter->iRowid = sqlite3_column_int64(pSorter->pStmt, 0);
    nBlob = sqlite3_column_bytes(pSorter->pStmt, 1);
    aBlob = a = sqlite3_column_blob(pSorter->pStmt, 1);

    /* nBlob==0 in detail=none mode. */
    if( nBlob>0 ){
      for(i=0; i<(pSorter->nIdx-1); i++){
        int iVal;
        a += fts5GetVarint32(a, iVal);
        iOff += iVal;
        pSorter->aIdx[i] = iOff;
      }
      pSorter->aIdx[i] = &aBlob[nBlob] - a;
      pSorter->aPoslist = a;
    }

    fts5CsrNewrow(pCsr);
  }

  return rc;
}